

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroup::updateDirection(QParallelAnimationGroup *this,Direction direction)

{
  bool bVar1;
  State SVar2;
  parameter_type pVar3;
  int iVar4;
  QParallelAnimationGroupPrivate *pQVar5;
  const_iterator o;
  int in_ESI;
  QList<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *unaff_retaddr;
  QParallelAnimationGroupPrivate *d;
  AnimationListConstIt cend;
  AnimationListConstIt it;
  int local_44;
  const_iterator local_10;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QParallelAnimationGroup *)0x67d9ae);
  SVar2 = QAbstractAnimation::state((QAbstractAnimation *)in_RDI);
  if (SVar2 == Stopped) {
    if (in_ESI == 0) {
      pQVar5->lastLoop = 0;
      pQVar5->lastCurrentTime = 0;
    }
    else {
      pVar3 = QObjectBindableProperty::operator_cast_to_int
                        ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                          *)0x67da88);
      if (pVar3 == -1) {
        local_44 = 0;
      }
      else {
        pVar3 = QObjectBindableProperty::operator_cast_to_int
                          ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                            *)0x67daa6);
        local_44 = pVar3 + -1;
      }
      pQVar5->lastLoop = local_44;
      iVar4 = (**(code **)&(in_RDI->d).d[6].super_QArrayData)();
      pQVar5->lastCurrentTime = iVar4;
    }
  }
  else {
    local_10.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QAbstractAnimation_*>::constBegin(in_RDI);
    o = QList<QAbstractAnimation_*>::constEnd(in_RDI);
    while (bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_10,o), bVar1) {
      QList<QAbstractAnimation_*>::const_iterator::operator*(&local_10);
      QAbstractAnimation::setDirection(unaff_retaddr,(Direction)((ulong)lVar6 >> 0x20));
      QList<QAbstractAnimation_*>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QParallelAnimationGroup);
    //we need to update the direction of the current animation
    if (state() != Stopped) {
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it)
            (*it)->setDirection(direction);
    } else {
        if (direction == Forward) {
            d->lastLoop = 0;
            d->lastCurrentTime = 0;
        } else {
            // Looping backwards with loopCount == -1 does not really work well...
            d->lastLoop = (d->loopCount == -1 ? 0 : d->loopCount - 1);
            d->lastCurrentTime = duration();
        }
    }
}